

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
* __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeImpl
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *__return_storage_ptr__,BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData)

{
  PromiseFulfiller<kj::AsyncCapabilityStream::ReadResult> *pPVar1;
  size_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar *puVar5;
  ArrayPtr<const_unsigned_char> *pAVar6;
  Retry local_c8;
  Done local_a1;
  ArrayPtr<const_unsigned_char> local_a0;
  ReadResult local_90;
  size_t local_80;
  size_t n_1;
  ArrayPtr<const_unsigned_char> *local_70;
  Done local_61;
  ReadResult local_60;
  ArrayPtr<unsigned_char> local_50;
  size_t local_40;
  size_t n;
  BlockedRead *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  moreData_local.size_ = (size_t)data.ptr;
  moreData_local.ptr = (ArrayPtr<const_unsigned_char> *)moreData.size_;
  this_local = (BlockedRead *)moreData.ptr;
  n = (size_t)this;
  while( true ) {
    sVar2 = ArrayPtr<const_unsigned_char>::size
                      ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
    sVar3 = ArrayPtr<unsigned_char>::size(&this->readBuffer);
    if (sVar3 <= sVar2) break;
    local_40 = ArrayPtr<const_unsigned_char>::size
                         ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
    puVar4 = ArrayPtr<unsigned_char>::begin(&this->readBuffer);
    puVar5 = ArrayPtr<const_unsigned_char>::begin
                       ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
    memcpy(puVar4,puVar5,local_40);
    sVar2 = local_40;
    (this->readSoFar).byteCount = local_40 + (this->readSoFar).byteCount;
    sVar3 = ArrayPtr<unsigned_char>::size(&this->readBuffer);
    local_50 = ArrayPtr<unsigned_char>::slice(&this->readBuffer,sVar2,sVar3);
    (this->readBuffer).ptr = local_50.ptr;
    (this->readBuffer).size_ = local_50.size_;
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    if (sVar2 == 0) {
      if (this->minBytes <= (this->readSoFar).byteCount) {
        pPVar1 = this->fulfiller;
        local_60 = cp<kj::AsyncCapabilityStream::ReadResult>(&this->readSoFar);
        (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_60);
        endState(this->pipe,(AsyncIoStream *)this);
      }
      OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
      ::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,int>
                ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
                  *)__return_storage_ptr__,&local_61);
      return __return_storage_ptr__;
    }
    pAVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0);
    moreData_local.size_ = (size_t)pAVar6->ptr;
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    _n_1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar2);
    this_local = (BlockedRead *)n_1;
    moreData_local.ptr = local_70;
  }
  local_80 = ArrayPtr<unsigned_char>::size(&this->readBuffer);
  (this->readSoFar).byteCount = local_80 + (this->readSoFar).byteCount;
  pPVar1 = this->fulfiller;
  local_90 = cp<kj::AsyncCapabilityStream::ReadResult>(&this->readSoFar);
  (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_90);
  endState(this->pipe,(AsyncIoStream *)this);
  puVar4 = ArrayPtr<unsigned_char>::begin(&this->readBuffer);
  puVar5 = ArrayPtr<const_unsigned_char>::begin
                     ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
  memcpy(puVar4,puVar5,local_80);
  sVar2 = local_80;
  sVar3 = ArrayPtr<const_unsigned_char>::size
                    ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
  local_a0 = ArrayPtr<const_unsigned_char>::slice
                       ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_,sVar2,sVar3);
  moreData_local.size_ = (size_t)local_a0.ptr;
  sVar2 = local_a0.size_;
  sVar3 = ArrayPtr<const_unsigned_char>::size
                    ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
  if ((sVar3 == 0) &&
     (sVar3 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local),
     sVar3 == 0)) {
    OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
    ::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,int>
              ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
                *)__return_storage_ptr__,&local_a1);
    return __return_storage_ptr__;
  }
  local_c8.data.ptr = (uchar *)moreData_local.size_;
  local_c8.data.size_ = sVar2;
  local_c8.moreData.ptr = (ArrayPtr<const_unsigned_char> *)this_local;
  local_c8.moreData.size_ = (size_t)moreData_local.ptr;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  ::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry,int>
            ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
              *)__return_storage_ptr__,&local_c8);
  return __return_storage_ptr__;
}

Assistant:

OneOf<Done, Retry> writeImpl(ArrayPtr<const byte> data,
                                 ArrayPtr<const ArrayPtr<const byte>> moreData) {
      for (;;) {
        if (data.size() < readBuffer.size()) {
          // First write segment consumes a portion of the read buffer but not all of it.
          auto n = data.size();
          memcpy(readBuffer.begin(), data.begin(), n);
          readSoFar.byteCount += n;
          readBuffer = readBuffer.slice(n, readBuffer.size());
          if (moreData.size() == 0) {
            // Consumed all written pieces.
            if (readSoFar.byteCount >= minBytes) {
              // We've read enough to close out this read.
              fulfiller.fulfill(kj::cp(readSoFar));
              pipe.endState(*this);
            }
            return Done();
          }
          data = moreData[0];
          moreData = moreData.slice(1, moreData.size());
          // loop
        } else {
          // First write segment consumes entire read buffer.
          auto n = readBuffer.size();
          readSoFar.byteCount += n;
          fulfiller.fulfill(kj::cp(readSoFar));
          pipe.endState(*this);
          memcpy(readBuffer.begin(), data.begin(), n);

          data = data.slice(n, data.size());
          if (data.size() == 0 && moreData.size() == 0) {
            return Done();
          } else {
            // Note: Even if `data` is empty, we don't replace it with moreData[0], because the
            //   retry might need to use write(ArrayPtr<ArrayPtr<byte>>) which doesn't allow
            //   passing a separate first segment.
            return Retry { data, moreData };
          }
        }
      }
    }